

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::startsWith(string *s,string *prefix)

{
  string *psVar1;
  ulong uVar2;
  ulong uVar3;
  __type_conflict local_42;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *prefix_local;
  string *s_local;
  
  local_20 = prefix;
  prefix_local = s;
  uVar2 = std::__cxx11::string::size();
  uVar3 = std::__cxx11::string::size();
  psVar1 = prefix_local;
  local_42 = false;
  if (uVar3 <= uVar2) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)&local_40,(ulong)psVar1);
    local_42 = std::operator==(&local_40,local_20);
  }
  s_local._7_1_ = local_42;
  if (uVar3 <= uVar2) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  return (bool)(s_local._7_1_ & 1);
}

Assistant:

bool startsWith( std::string const& s, std::string const& prefix ) {
        return s.size() >= prefix.size() && s.substr( 0, prefix.size() ) == prefix;
    }